

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Calc(MP<135UL,_GF2::MOLex<135UL>_> *this,WW<135UL> *val)

{
  bool bVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  
  bVar2 = false;
  p_Var3 = (_List_node_base *)this;
  while (p_Var3 = (((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)&p_Var3->_M_next)->
                  super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)this) {
    bVar1 = MM<135UL>::Calc((MM<135UL> *)(p_Var3 + 1),val);
    bVar2 = (bool)(bVar2 ^ bVar1);
  }
  return bVar2;
}

Assistant:

bool Calc(const WW<_n>& val) const
	{
		bool ret = 0;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			ret ^= iter->Calc(val);
		return ret;
	}